

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_encryption_data.c
# Opt level: O0

void test_read_format_zip_encryption_data(void)

{
  archive *a_00;
  char buff [128];
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_00000370;
  archive *in_stack_ffffffffffffff58;
  archive *paVar1;
  archive_entry *paVar2;
  archive_entry **ppaVar3;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar4;
  uint in_stack_ffffffffffffff64;
  wchar_t in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  wchar_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  archive *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa8;
  undefined8 local_10;
  
  extract_reference_file(in_stack_00000370);
  a_00 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
  archive_read_support_filter_all(in_stack_ffffffffffffff58);
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1baeb8,in_stack_ffffffffffffff90);
  archive_read_support_format_all(paVar1);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1baef7,in_stack_ffffffffffffff90);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1baf43,in_stack_ffffffffffffff90);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1baf85,in_stack_ffffffffffffff90);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (archive_entry **)paVar1);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (longlong)a_00,(char *)0x1bafcc,in_stack_ffffffffffffff90);
  archive_entry_mode(local_10);
  paVar2 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),0,
                      (char *)0x1bb00c,in_stack_ffffffffffffff90);
  archive_entry_pathname(paVar2);
  uVar4 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)((ulong)in_stack_ffffffffffffff64 << 0x20),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
  archive_entry_size(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb094,
                      in_stack_ffffffffffffff90);
  archive_entry_is_data_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb0d2,
                      in_stack_ffffffffffffff90);
  archive_entry_is_metadata_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb10d,
                      in_stack_ffffffffffffff90);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb14d,in_stack_ffffffffffffff90);
  archive_read_data(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    (size_t)in_stack_ffffffffffffff88);
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb197,
                      in_stack_ffffffffffffff90);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffff64,uVar4),ppaVar3);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb1de,in_stack_ffffffffffffff90);
  archive_entry_mode(local_10);
  paVar2 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb21e,
                      in_stack_ffffffffffffff90);
  archive_entry_pathname(paVar2);
  uVar4 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)((ulong)in_stack_ffffffffffffff64 << 0x20),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
  archive_entry_size(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb2a6,
                      in_stack_ffffffffffffff90);
  archive_entry_is_data_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb2e4,
                      in_stack_ffffffffffffff90);
  archive_entry_is_metadata_encrypted(local_10);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb31f,
                      in_stack_ffffffffffffff90);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb35f,in_stack_ffffffffffffff90);
  archive_read_data(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    (size_t)in_stack_ffffffffffffff88);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb3a9,
                      in_stack_ffffffffffffff90);
  archive_file_count(a_00);
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb3e7,
                      in_stack_ffffffffffffff90);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffff64,uVar4),ppaVar3);
  paVar1 = a_00;
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb42f,in_stack_ffffffffffffff90);
  archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff64,uVar4),
                      (int)((ulong)paVar1 >> 0x20));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb470,in_stack_ffffffffffffff90);
  archive_format(a_00);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),(longlong)a_00,
                      (char *)0x1bb4b0,in_stack_ffffffffffffff90);
  archive_read_close((archive *)0x1bb4bd);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb4eb,
                      in_stack_ffffffffffffff90);
  archive_read_free((archive *)0x1bb4f8);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (char *)CONCAT44(in_stack_ffffffffffffff64,uVar4),0,(char *)0x1bb526,
                      in_stack_ffffffffffffff90);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_encryption_data)
{
	/* This file is password protected (encrypted). The headers
	   are NOT encrypted. Password is "12345678". */
	const char *refname = "test_read_format_zip_encryption_data.zip";
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, 
               archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW, archive_read_has_encrypted_entries(a));

	/* Verify encrypted file "bar.txt" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0664), archive_entry_mode(ae));
	assertEqualString("bar.txt", archive_entry_pathname(ae));
	assertEqualInt(20, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));
	
	/* Verify encrypted file "foo.txt" */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0664), archive_entry_mode(ae));
	assertEqualString("foo.txt", archive_entry_pathname(ae));
	assertEqualInt(20, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));
	
	assertEqualInt(2, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}